

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  Scene *pSVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  vfloat<4> vVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  bool bVar19;
  uint uVar20;
  undefined4 uVar21;
  float *vertices;
  Scene *pSVar22;
  float *pfVar23;
  Geometry *pGVar24;
  Geometry *pGVar25;
  Geometry *pGVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  RTCIntersectArguments *pRVar30;
  size_t sVar31;
  NodeRef root;
  long lVar32;
  Intersectors *pIVar33;
  NodeRef *pNVar34;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar35;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar36;
  long lVar37;
  ulong uVar38;
  float fVar39;
  float fVar53;
  float fVar54;
  vint4 bi_1;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar55;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar56;
  float fVar67;
  float fVar68;
  vint4 bi;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar69;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vfloat_impl<4> vVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar70;
  float fVar73;
  float fVar74;
  vint4 ai;
  float fVar75;
  vfloat_impl<4> vVar71;
  undefined1 auVar72 [16];
  float fVar76;
  float fVar80;
  float fVar81;
  vint4 ai_1;
  undefined1 auVar77 [16];
  float fVar82;
  vfloat_impl<4> vVar78;
  undefined1 auVar79 [16];
  float fVar83;
  float fVar86;
  float fVar88;
  vint4 ai_3;
  undefined1 auVar84 [16];
  uint uVar87;
  float fVar89;
  undefined1 auVar85 [16];
  uint uVar95;
  uint uVar96;
  vint4 bi_2;
  undefined1 auVar90 [16];
  uint uVar97;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar98;
  float fVar99;
  float fVar103;
  float fVar105;
  vint4 bi_3;
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  uint uVar109;
  uint uVar114;
  uint uVar115;
  vint4 ai_2;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar116;
  uint uVar117;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  uint uVar129;
  uint uVar130;
  uint uVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  uint uVar136;
  float fVar137;
  uint uVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 local_1a78 [8];
  float fStack_1a70;
  float fStack_1a6c;
  Precalculations pre;
  undefined1 local_1a28 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_19b8 [16];
  vbool<4> terminated;
  undefined8 uStack_1940;
  undefined1 local_1928 [36];
  float fStack_1904;
  float fStack_1900;
  float fStack_18fc;
  undefined1 local_18f8 [8];
  float fStack_18f0;
  float fStack_18ec;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_18e8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_18d8;
  uint local_18c8;
  uint uStack_18c4;
  uint uStack_18c0;
  uint uStack_18bc;
  uint local_18b8;
  uint uStack_18b4;
  uint uStack_18b0;
  uint uStack_18ac;
  uint local_18a8;
  uint uStack_18a4;
  uint uStack_18a0;
  uint uStack_189c;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  Vec3vf<4> Ng;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar18 = mm_lookupmask_ps._248_8_;
  uVar17 = mm_lookupmask_ps._240_8_;
  uVar16 = mm_lookupmask_ps._8_8_;
  uVar15 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    pRVar30 = (RTCIntersectArguments *)ray;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pRVar30 = context->args,
       (pRVar30->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent((BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
                        *)valid_i,(vint<4> *)This,(Intersectors *)ray,(RayK<4> *)context,
                       (RayQueryContext *)This);
      return;
    }
    auVar146._8_4_ = 0xffffffff;
    auVar146._0_8_ = 0xffffffffffffffff;
    auVar146._12_4_ = 0xffffffff;
    auVar77 = *(undefined1 (*) [16])(ray + 0x80);
    auVar84._0_12_ = ZEXT812(0);
    auVar84._12_4_ = 0;
    auVar57._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar77._0_4_);
    auVar57._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar77._4_4_);
    auVar57._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar77._8_4_);
    auVar57._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar77._12_4_);
    iVar27 = movmskps((int)pRVar30,auVar57);
    if (iVar27 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar98 = (float)DAT_01f4bd50;
      fVar103 = DAT_01f4bd50._4_4_;
      fVar105 = DAT_01f4bd50._8_4_;
      fVar107 = DAT_01f4bd50._12_4_;
      auVar41._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar103);
      auVar41._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar98);
      auVar41._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar105);
      auVar41._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar107);
      auVar110 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f4bd50,auVar41
                         );
      auVar58._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar103);
      auVar58._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar98);
      auVar58._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar105);
      auVar58._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar107);
      auVar58 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f4bd50,auVar58)
      ;
      auVar40._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar103);
      auVar40._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar98);
      auVar40._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar105);
      auVar40._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar107);
      auVar90 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f4bd50,auVar40)
      ;
      auVar41 = rcpps(auVar40,auVar110);
      fVar98 = auVar41._0_4_;
      auVar111._0_4_ = auVar110._0_4_ * fVar98;
      fVar103 = auVar41._4_4_;
      auVar111._4_4_ = auVar110._4_4_ * fVar103;
      fVar105 = auVar41._8_4_;
      auVar111._8_4_ = auVar110._8_4_ * fVar105;
      fVar107 = auVar41._12_4_;
      auVar111._12_4_ = auVar110._12_4_ * fVar107;
      tray.rdir.field_0._0_4_ = (1.0 - auVar111._0_4_) * fVar98 + fVar98;
      tray.rdir.field_0._4_4_ = (1.0 - auVar111._4_4_) * fVar103 + fVar103;
      tray.rdir.field_0._8_4_ = (1.0 - auVar111._8_4_) * fVar105 + fVar105;
      tray.rdir.field_0._12_4_ = (1.0 - auVar111._12_4_) * fVar107 + fVar107;
      auVar41 = rcpps(auVar111,auVar58);
      fVar98 = auVar41._0_4_;
      fVar103 = auVar41._4_4_;
      fVar105 = auVar41._8_4_;
      fVar107 = auVar41._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar58._0_4_ * fVar98) * fVar98 + fVar98;
      tray.rdir.field_0._20_4_ = (1.0 - auVar58._4_4_ * fVar103) * fVar103 + fVar103;
      tray.rdir.field_0._24_4_ = (1.0 - auVar58._8_4_ * fVar105) * fVar105 + fVar105;
      tray.rdir.field_0._28_4_ = (1.0 - auVar58._12_4_ * fVar107) * fVar107 + fVar107;
      auVar41 = rcpps(auVar41,auVar90);
      fVar98 = auVar41._0_4_;
      fVar103 = auVar41._4_4_;
      fVar105 = auVar41._8_4_;
      fVar107 = auVar41._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar90._0_4_ * fVar98) * fVar98 + fVar98;
      tray.rdir.field_0._36_4_ = (1.0 - auVar90._4_4_ * fVar103) * fVar103 + fVar103;
      tray.rdir.field_0._40_4_ = (1.0 - auVar90._8_4_ * fVar105) * fVar105 + fVar105;
      tray.rdir.field_0._44_4_ = (1.0 - auVar90._12_4_ * fVar107) * fVar107 + fVar107;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar90._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar90._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar90._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar90._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar90);
      auVar110._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar110._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar110._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar110._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar110);
      auVar41 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar84);
      auVar77 = maxps(auVar77,auVar84);
      fVar98 = (float)DAT_01f45a30;
      fVar103 = DAT_01f45a30._4_4_;
      fVar105 = DAT_01f45a30._8_4_;
      fVar107 = DAT_01f45a30._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar41,auVar57);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar77,auVar57);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar146 ^ auVar57);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar28 = 3;
        pGVar26 = (Geometry *)0x0;
      }
      else {
        pGVar26 = (Geometry *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        uVar28 = ((char)pGVar26 == '\0') + 2;
      }
      pNVar34 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar20 = 0x2223f80;
      paVar35 = &stack_near[2].field_0;
LAB_006c908a:
      do {
        do {
          root.ptr = pNVar34[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006ca23e;
          pNVar34 = pNVar34 + -1;
          paVar36 = paVar35 + -1;
          local_1a78._0_4_ = paVar36->v[0];
          local_1a78._4_4_ = *(float *)((long)paVar35 + -0xc);
          fStack_1a70 = *(float *)((long)paVar35 + -8);
          fStack_1a6c = *(float *)((long)paVar35 + -4);
          vVar14.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar36->v;
          auVar77._4_4_ = -(uint)((float)local_1a78._4_4_ < tray.tfar.field_0.v[1]);
          auVar77._0_4_ = -(uint)((float)local_1a78._0_4_ < tray.tfar.field_0.v[0]);
          auVar77._8_4_ = -(uint)(fStack_1a70 < tray.tfar.field_0.v[2]);
          auVar77._12_4_ = -(uint)(fStack_1a6c < tray.tfar.field_0.v[3]);
          uVar20 = movmskps(uVar20,auVar77);
          paVar35 = paVar36;
        } while (uVar20 == 0);
        uVar38 = (ulong)(byte)uVar20;
        uVar95 = uVar20 & 0xff;
        if (uVar28 < (uint)POPCOUNT(uVar95)) {
LAB_006c90d1:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006ca23e;
              auVar44._4_4_ = -(uint)((float)local_1a78._4_4_ < tray.tfar.field_0.v[1]);
              auVar44._0_4_ = -(uint)((float)local_1a78._0_4_ < tray.tfar.field_0.v[0]);
              auVar44._8_4_ = -(uint)(fStack_1a70 < tray.tfar.field_0.v[2]);
              auVar44._12_4_ = -(uint)(fStack_1a6c < tray.tfar.field_0.v[3]);
              uVar20 = movmskps(uVar20,auVar44);
              paVar35 = paVar36;
              if (uVar20 == 0) goto LAB_006c908a;
              valid_i = (vint<4> *)((ulong)((uint)root.ptr & 0xf) - 8);
              auVar45._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar45._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
              auVar45._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
              lVar32 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              pIVar33 = (Intersectors *)0x0;
              goto LAB_006c92c2;
            }
            sVar31 = 8;
            local_1a78._0_4_ = fVar98;
            local_1a78._4_4_ = fVar103;
            fStack_1a70 = fVar105;
            fStack_1a6c = fVar107;
            for (pGVar26 = (Geometry *)0x0;
                (pGVar26 != (Geometry *)&DAT_00000004 &&
                (sVar1 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + (long)pGVar26 * 8),
                sVar1 != 8));
                pGVar26 = (Geometry *)((long)&(pGVar26->super_RefCount)._vptr_RefCount + 1)) {
              fVar108 = *(float *)(root.ptr + 0x20 + (long)pGVar26 * 4);
              fVar39 = *(float *)(root.ptr + 0x30 + (long)pGVar26 * 4);
              fVar53 = *(float *)(root.ptr + 0x40 + (long)pGVar26 * 4);
              fVar55 = *(float *)(root.ptr + 0x50 + (long)pGVar26 * 4);
              fVar70 = (fVar108 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar73 = (fVar108 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar74 = (fVar108 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar75 = (fVar108 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
              fVar76 = (fVar53 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
              fVar80 = (fVar53 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
              fVar81 = (fVar53 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar82 = (fVar53 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
              fVar108 = *(float *)(root.ptr + 0x60 + (long)pGVar26 * 4);
              fVar83 = (fVar108 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              fVar86 = (fVar108 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
              fVar88 = (fVar108 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              fVar89 = (fVar108 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              fVar56 = (fVar39 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar67 = (fVar39 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar68 = (fVar39 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar69 = (fVar39 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
              fVar39 = (fVar55 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
              fVar53 = (fVar55 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
              fVar54 = (fVar55 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar55 = (fVar55 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
              fVar108 = *(float *)(root.ptr + 0x70 + (long)pGVar26 * 4);
              fVar99 = (fVar108 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              fVar104 = (fVar108 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_
              ;
              fVar106 = (fVar108 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_
              ;
              fVar108 = (fVar108 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_
              ;
              uVar20 = (uint)((int)fVar56 < (int)fVar70) * (int)fVar56 |
                       (uint)((int)fVar56 >= (int)fVar70) * (int)fVar70;
              uVar95 = (uint)((int)fVar67 < (int)fVar73) * (int)fVar67 |
                       (uint)((int)fVar67 >= (int)fVar73) * (int)fVar73;
              uVar96 = (uint)((int)fVar68 < (int)fVar74) * (int)fVar68 |
                       (uint)((int)fVar68 >= (int)fVar74) * (int)fVar74;
              uVar97 = (uint)((int)fVar69 < (int)fVar75) * (int)fVar69 |
                       (uint)((int)fVar69 >= (int)fVar75) * (int)fVar75;
              uVar109 = (uint)((int)fVar39 < (int)fVar76) * (int)fVar39 |
                        (uint)((int)fVar39 >= (int)fVar76) * (int)fVar76;
              uVar114 = (uint)((int)fVar53 < (int)fVar80) * (int)fVar53 |
                        (uint)((int)fVar53 >= (int)fVar80) * (int)fVar80;
              uVar115 = (uint)((int)fVar54 < (int)fVar81) * (int)fVar54 |
                        (uint)((int)fVar54 >= (int)fVar81) * (int)fVar81;
              uVar117 = (uint)((int)fVar55 < (int)fVar82) * (int)fVar55 |
                        (uint)((int)fVar55 >= (int)fVar82) * (int)fVar82;
              uVar109 = ((int)uVar109 < (int)uVar20) * uVar20 |
                        ((int)uVar109 >= (int)uVar20) * uVar109;
              uVar114 = ((int)uVar114 < (int)uVar95) * uVar95 |
                        ((int)uVar114 >= (int)uVar95) * uVar114;
              uVar115 = ((int)uVar115 < (int)uVar96) * uVar96 |
                        ((int)uVar115 >= (int)uVar96) * uVar115;
              uVar117 = ((int)uVar117 < (int)uVar97) * uVar97 |
                        ((int)uVar117 >= (int)uVar97) * uVar117;
              uVar20 = (uint)((int)fVar99 < (int)fVar83) * (int)fVar99 |
                       (uint)((int)fVar99 >= (int)fVar83) * (int)fVar83;
              uVar95 = (uint)((int)fVar104 < (int)fVar86) * (int)fVar104 |
                       (uint)((int)fVar104 >= (int)fVar86) * (int)fVar86;
              uVar96 = (uint)((int)fVar106 < (int)fVar88) * (int)fVar106 |
                       (uint)((int)fVar106 >= (int)fVar88) * (int)fVar88;
              uVar97 = (uint)((int)fVar108 < (int)fVar89) * (int)fVar108 |
                       (uint)((int)fVar108 >= (int)fVar89) * (int)fVar89;
              auVar91._0_4_ =
                   ((int)uVar20 < (int)uVar109) * uVar109 | ((int)uVar20 >= (int)uVar109) * uVar20;
              auVar91._4_4_ =
                   ((int)uVar95 < (int)uVar114) * uVar114 | ((int)uVar95 >= (int)uVar114) * uVar95;
              auVar91._8_4_ =
                   ((int)uVar96 < (int)uVar115) * uVar115 | ((int)uVar96 >= (int)uVar115) * uVar96;
              auVar91._12_4_ =
                   ((int)uVar97 < (int)uVar117) * uVar117 | ((int)uVar97 >= (int)uVar117) * uVar97;
              uVar109 = (uint)((int)fVar56 < (int)fVar70) * (int)fVar70 |
                        (uint)((int)fVar56 >= (int)fVar70) * (int)fVar56;
              uVar114 = (uint)((int)fVar67 < (int)fVar73) * (int)fVar73 |
                        (uint)((int)fVar67 >= (int)fVar73) * (int)fVar67;
              uVar115 = (uint)((int)fVar68 < (int)fVar74) * (int)fVar74 |
                        (uint)((int)fVar68 >= (int)fVar74) * (int)fVar68;
              uVar117 = (uint)((int)fVar69 < (int)fVar75) * (int)fVar75 |
                        (uint)((int)fVar69 >= (int)fVar75) * (int)fVar69;
              uVar20 = (uint)((int)fVar39 < (int)fVar76) * (int)fVar76 |
                       (uint)((int)fVar39 >= (int)fVar76) * (int)fVar39;
              uVar95 = (uint)((int)fVar53 < (int)fVar80) * (int)fVar80 |
                       (uint)((int)fVar53 >= (int)fVar80) * (int)fVar53;
              uVar96 = (uint)((int)fVar54 < (int)fVar81) * (int)fVar81 |
                       (uint)((int)fVar54 >= (int)fVar81) * (int)fVar54;
              uVar97 = (uint)((int)fVar55 < (int)fVar82) * (int)fVar82 |
                       (uint)((int)fVar55 >= (int)fVar82) * (int)fVar55;
              uVar20 = ((int)uVar109 < (int)uVar20) * uVar109 |
                       ((int)uVar109 >= (int)uVar20) * uVar20;
              uVar95 = ((int)uVar114 < (int)uVar95) * uVar114 |
                       ((int)uVar114 >= (int)uVar95) * uVar95;
              uVar96 = ((int)uVar115 < (int)uVar96) * uVar115 |
                       ((int)uVar115 >= (int)uVar96) * uVar96;
              uVar97 = ((int)uVar117 < (int)uVar97) * uVar117 |
                       ((int)uVar117 >= (int)uVar97) * uVar97;
              uVar109 = (uint)((int)fVar99 < (int)fVar83) * (int)fVar83 |
                        (uint)((int)fVar99 >= (int)fVar83) * (int)fVar99;
              uVar114 = (uint)((int)fVar104 < (int)fVar86) * (int)fVar86 |
                        (uint)((int)fVar104 >= (int)fVar86) * (int)fVar104;
              uVar115 = (uint)((int)fVar106 < (int)fVar88) * (int)fVar88 |
                        (uint)((int)fVar106 >= (int)fVar88) * (int)fVar106;
              uVar117 = (uint)((int)fVar108 < (int)fVar89) * (int)fVar89 |
                        (uint)((int)fVar108 >= (int)fVar89) * (int)fVar108;
              uVar20 = ((int)uVar20 < (int)uVar109) * uVar20 |
                       ((int)uVar20 >= (int)uVar109) * uVar109;
              uVar95 = ((int)uVar95 < (int)uVar114) * uVar95 |
                       ((int)uVar95 >= (int)uVar114) * uVar114;
              uVar96 = ((int)uVar96 < (int)uVar115) * uVar96 |
                       ((int)uVar96 >= (int)uVar115) * uVar115;
              uVar97 = ((int)uVar97 < (int)uVar117) * uVar97 |
                       ((int)uVar97 >= (int)uVar117) * uVar117;
              auVar42._4_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar91._4_4_) * auVar91._4_4_ |
                                  (uint)(tray.tnear.field_0.i[1] >= (int)auVar91._4_4_) *
                                  tray.tnear.field_0.i[1]) <=
                          (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar95) *
                                  tray.tfar.field_0.i[1] |
                                 (tray.tfar.field_0.i[1] >= (int)uVar95) * uVar95));
              auVar42._0_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar91._0_4_) * auVar91._0_4_ |
                                  (uint)(tray.tnear.field_0.i[0] >= (int)auVar91._0_4_) *
                                  tray.tnear.field_0.i[0]) <=
                          (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar20) *
                                  tray.tfar.field_0.i[0] |
                                 (tray.tfar.field_0.i[0] >= (int)uVar20) * uVar20));
              auVar42._8_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar91._8_4_) * auVar91._8_4_ |
                                  (uint)(tray.tnear.field_0.i[2] >= (int)auVar91._8_4_) *
                                  tray.tnear.field_0.i[2]) <=
                          (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar96) *
                                  tray.tfar.field_0.i[2] |
                                 (tray.tfar.field_0.i[2] >= (int)uVar96) * uVar96));
              auVar42._12_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar91._12_4_) * auVar91._12_4_
                                  | (uint)(tray.tnear.field_0.i[3] >= (int)auVar91._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                          (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar97) *
                                  tray.tfar.field_0.i[3] |
                                 (tray.tfar.field_0.i[3] >= (int)uVar97) * uVar97));
              uVar20 = movmskps((int)valid_i,auVar42);
              valid_i = (vint<4> *)(ulong)uVar20;
              if (uVar20 == 0) {
                auVar60._4_4_ = local_1a78._4_4_;
                auVar60._0_4_ = local_1a78._0_4_;
                auVar60._8_4_ = fStack_1a70;
                auVar60._12_4_ = fStack_1a6c;
                sVar1 = sVar31;
              }
              else {
                auVar59._4_4_ = fVar103;
                auVar59._0_4_ = fVar98;
                auVar59._8_4_ = fVar105;
                auVar59._12_4_ = fVar107;
                auVar60 = blendvps(auVar59,auVar91,auVar42);
                if (sVar31 != 8) {
                  pNVar34->ptr = sVar31;
                  pNVar34 = pNVar34 + 1;
                  paVar36->v[0] = (float)local_1a78._0_4_;
                  paVar36->v[1] = (float)local_1a78._4_4_;
                  paVar36->v[2] = fStack_1a70;
                  paVar36->v[3] = fStack_1a6c;
                  paVar36 = paVar36 + 1;
                }
              }
              sVar31 = sVar1;
              local_1a78._0_4_ = auVar60._0_4_;
              local_1a78._4_4_ = auVar60._4_4_;
              fStack_1a70 = auVar60._8_4_;
              fStack_1a6c = auVar60._12_4_;
            }
            if (sVar31 == 8) goto LAB_006c926c;
            auVar43._4_4_ = -(uint)((float)local_1a78._4_4_ < tray.tfar.field_0.v[1]);
            auVar43._0_4_ = -(uint)((float)local_1a78._0_4_ < tray.tfar.field_0.v[0]);
            auVar43._8_4_ = -(uint)(fStack_1a70 < tray.tfar.field_0.v[2]);
            auVar43._12_4_ = -(uint)(fStack_1a6c < tray.tfar.field_0.v[3]);
            uVar21 = movmskps((int)(root.ptr & 0xfffffffffffffff0),auVar43);
            uVar20 = POPCOUNT(uVar21);
            root.ptr = sVar31;
          } while ((byte)uVar28 < (byte)uVar20);
          pNVar34->ptr = sVar31;
          pNVar34 = pNVar34 + 1;
          paVar36->v[0] = (float)local_1a78._0_4_;
          paVar36->v[1] = (float)local_1a78._4_4_;
          paVar36->v[2] = fStack_1a70;
          paVar36->v[3] = fStack_1a6c;
          paVar36 = paVar36 + 1;
LAB_006c926c:
          uVar20 = 4;
        }
        else {
          while (uVar38 != 0) {
            pGVar25 = (Geometry *)0x0;
            if (uVar38 != 0) {
              for (; (uVar38 >> (long)pGVar25 & 1) == 0;
                  pGVar25 = (Geometry *)((long)&(pGVar25->super_RefCount)._vptr_RefCount + 1)) {
              }
            }
            uVar38 = uVar38 & uVar38 - 1;
            pGVar26 = pGVar25;
            valid_i = (vint<4> *)This;
            bVar19 = occluded1(This,bvh,root,(size_t)pGVar25,&pre,ray,&tray,context);
            if (bVar19) {
              terminated.field_0.i[(long)pGVar25] = -1;
            }
          }
          uVar96 = movmskps((int)pGVar26,(undefined1  [16])terminated.field_0);
          pGVar26 = (Geometry *)(ulong)uVar96;
          uVar20 = 3;
          fVar98 = INFINITY;
          fVar103 = INFINITY;
          fVar105 = INFINITY;
          fVar107 = INFINITY;
          local_1a78._0_4_ = vVar14.field_0._0_4_;
          local_1a78._4_4_ = vVar14.field_0._4_4_;
          fStack_1a70 = vVar14.field_0._8_4_;
          fStack_1a6c = vVar14.field_0._12_4_;
          if (uVar96 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            uVar20 = 2;
          }
          if (uVar28 < (uint)POPCOUNT(uVar95)) goto LAB_006c90d1;
        }
        paVar35 = paVar36;
      } while (uVar20 != 3);
LAB_006ca23e:
      auVar52._0_4_ = auVar57._0_4_ & terminated.field_0.i[0];
      auVar52._4_4_ = auVar57._4_4_ & terminated.field_0.i[1];
      auVar52._8_4_ = auVar57._8_4_ & terminated.field_0.i[2];
      auVar52._12_4_ = auVar57._12_4_ & terminated.field_0.i[3];
      auVar77 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar52);
      *(undefined1 (*) [16])(ray + 0x80) = auVar77;
    }
  }
  return;
LAB_006c92c2:
  do {
    if (pIVar33 == (Intersectors *)valid_i) break;
    pSVar2 = context->scene;
    lVar37 = -0x10;
    uVar109 = auVar45._4_4_;
    uVar114 = auVar45._8_4_;
    uVar115 = auVar45._12_4_;
    pSVar22 = pSVar2;
    uVar20 = auVar45._0_4_;
    uVar95 = uVar109;
    uVar96 = uVar114;
    uVar97 = uVar115;
    do {
      uVar21 = SUB84(pSVar22,0);
      if ((lVar37 == 0) || (iVar27 = *(int *)(lVar32 + 0x10 + lVar37), iVar27 == -1))
      goto LAB_006ca122;
      uVar117 = *(uint *)(lVar32 + lVar37);
      pGVar25 = (Geometry *)(ulong)uVar117;
      pfVar23 = (pSVar2->vertices).items[(long)pGVar25];
      uVar38 = (ulong)*(uint *)(lVar32 + -0x40 + lVar37);
      uVar87 = *(uint *)(lVar32 + -0x30 + lVar37);
      fVar98 = pfVar23[uVar38];
      fVar103 = pfVar23[uVar38 + 1];
      fVar105 = pfVar23[uVar38 + 2];
      fVar107 = pfVar23[uVar87];
      fVar108 = pfVar23[(ulong)uVar87 + 1];
      fVar39 = pfVar23[(ulong)uVar87 + 2];
      uVar38 = (ulong)*(uint *)(lVar32 + -0x10 + lVar37);
      fVar53 = pfVar23[uVar38];
      fVar55 = pfVar23[uVar38 + 1];
      fVar54 = pfVar23[uVar38 + 2];
      fVar125 = fVar55 - fVar103;
      fVar132 = fVar103 - fVar108;
      fVar83 = fVar54 - fVar105;
      fVar121 = fVar105 - fVar39;
      fVar120 = fVar121 * fVar125 - fVar132 * fVar83;
      fVar118 = fVar53 - fVar98;
      fVar99 = fVar98 - fVar107;
      vVar61.field_0._0_4_ = fVar83 * fVar99 - fVar121 * fVar118;
      fVar119 = fVar118 * fVar132 - fVar125 * fVar99;
      fVar86 = fVar98 - *(float *)ray;
      fVar88 = fVar98 - *(float *)(ray + 4);
      fVar89 = fVar98 - *(float *)(ray + 8);
      fVar98 = fVar98 - *(float *)(ray + 0xc);
      fVar104 = fVar103 - *(float *)(ray + 0x10);
      fVar106 = fVar103 - *(float *)(ray + 0x14);
      fVar116 = fVar103 - *(float *)(ray + 0x18);
      fVar103 = fVar103 - *(float *)(ray + 0x1c);
      fVar142 = fVar105 - *(float *)(ray + 0x20);
      fVar147 = fVar105 - *(float *)(ray + 0x24);
      fVar150 = fVar105 - *(float *)(ray + 0x28);
      fVar105 = fVar105 - *(float *)(ray + 0x2c);
      fVar56 = *(float *)(ray + 0x50);
      fVar67 = *(float *)(ray + 0x54);
      fVar68 = *(float *)(ray + 0x58);
      fVar69 = *(float *)(ray + 0x5c);
      fVar70 = *(float *)(ray + 0x60);
      fVar73 = *(float *)(ray + 100);
      fVar74 = *(float *)(ray + 0x68);
      fVar75 = *(float *)(ray + 0x6c);
      fVar133 = fVar104 * fVar70 - fVar142 * fVar56;
      fVar134 = fVar106 * fVar73 - fVar147 * fVar67;
      fVar135 = fVar116 * fVar74 - fVar150 * fVar68;
      fVar137 = fVar103 * fVar75 - fVar105 * fVar69;
      fVar76 = *(float *)(ray + 0x40);
      fVar80 = *(float *)(ray + 0x44);
      fVar81 = *(float *)(ray + 0x48);
      fVar82 = *(float *)(ray + 0x4c);
      fVar143 = fVar142 * fVar76 - fVar86 * fVar70;
      fVar148 = fVar147 * fVar80 - fVar88 * fVar73;
      fVar151 = fVar150 * fVar81 - fVar89 * fVar74;
      fVar153 = fVar105 * fVar82 - fVar98 * fVar75;
      fVar154 = fVar86 * fVar56 - fVar104 * fVar76;
      fVar156 = fVar88 * fVar67 - fVar106 * fVar80;
      fVar158 = fVar89 * fVar68 - fVar116 * fVar81;
      fVar160 = fVar98 * fVar69 - fVar103 * fVar82;
      vVar61.field_0.v[1] = vVar61.field_0._0_4_;
      vVar61.field_0.v[2] = vVar61.field_0._0_4_;
      vVar61.field_0.v[3] = vVar61.field_0._0_4_;
      fVar76 = fVar76 * fVar120 + fVar56 * vVar61.field_0._0_4_ + fVar70 * fVar119;
      fVar80 = fVar80 * fVar120 + fVar67 * vVar61.field_0._0_4_ + fVar73 * fVar119;
      fVar81 = fVar81 * fVar120 + fVar68 * vVar61.field_0._0_4_ + fVar74 * fVar119;
      fVar75 = fVar82 * fVar120 + fVar69 * vVar61.field_0._0_4_ + fVar75 * fVar119;
      pGVar26 = (Geometry *)(ulong)*(uint *)(lVar32 + -0x20 + lVar37);
      uVar126 = (uint)fVar76 & 0x80000000;
      uVar127 = (uint)fVar80 & 0x80000000;
      uVar128 = (uint)fVar81 & 0x80000000;
      uVar130 = (uint)fVar75 & 0x80000000;
      fVar69 = (float)((uint)(fVar118 * fVar133 + fVar125 * fVar143 + fVar83 * fVar154) ^ uVar126);
      fVar70 = (float)((uint)(fVar118 * fVar134 + fVar125 * fVar148 + fVar83 * fVar156) ^ uVar127);
      fVar73 = (float)((uint)(fVar118 * fVar135 + fVar125 * fVar151 + fVar83 * fVar158) ^ uVar128);
      fVar74 = (float)((uint)(fVar118 * fVar137 + fVar125 * fVar153 + fVar83 * fVar160) ^ uVar130);
      auVar46._0_4_ = -(uint)(0.0 <= fVar69) & uVar20;
      auVar46._4_4_ = -(uint)(0.0 <= fVar70) & uVar95;
      auVar46._8_4_ = -(uint)(0.0 <= fVar73) & uVar96;
      auVar46._12_4_ = -(uint)(0.0 <= fVar74) & uVar97;
      iVar29 = movmskps(uVar87,auVar46);
      fVar56 = pfVar23[(long)pGVar26];
      fVar67 = pfVar23[(long)((long)&(pGVar26->super_RefCount)._vptr_RefCount + 1)];
      fVar68 = pfVar23[(long)((long)&(pGVar26->super_RefCount)._vptr_RefCount + 2)];
      if (iVar29 == 0) {
LAB_006c9514:
        iVar29 = (int)pfVar23;
      }
      else {
        fVar82 = (float)((uint)(fVar99 * fVar133 + fVar132 * fVar143 + fVar121 * fVar154) ^ uVar126)
        ;
        fVar83 = (float)((uint)(fVar99 * fVar134 + fVar132 * fVar148 + fVar121 * fVar156) ^ uVar127)
        ;
        fVar118 = (float)((uint)(fVar99 * fVar135 + fVar132 * fVar151 + fVar121 * fVar158) ^ uVar128
                         );
        fVar99 = (float)((uint)(fVar99 * fVar137 + fVar132 * fVar153 + fVar121 * fVar160) ^ uVar130)
        ;
        uVar129 = -(uint)(0.0 <= fVar82) & auVar46._0_4_;
        uVar131 = -(uint)(0.0 <= fVar83) & auVar46._4_4_;
        uVar136 = -(uint)(0.0 <= fVar118) & auVar46._8_4_;
        uVar138 = -(uint)(0.0 <= fVar99) & auVar46._12_4_;
        auVar9._4_4_ = uVar131;
        auVar9._0_4_ = uVar129;
        auVar9._8_4_ = uVar136;
        auVar9._12_4_ = uVar138;
        uVar87 = movmskps((int)pfVar23,auVar9);
        pfVar23 = (float *)(ulong)uVar87;
        if (uVar87 == 0) goto LAB_006c9514;
        fVar121 = ABS(fVar76);
        fVar125 = ABS(fVar80);
        fVar132 = ABS(fVar81);
        fVar133 = ABS(fVar75);
        uVar129 = -(uint)(fVar82 <= fVar121 - fVar69) & uVar129;
        uVar131 = -(uint)(fVar83 <= fVar125 - fVar70) & uVar131;
        uVar136 = -(uint)(fVar118 <= fVar132 - fVar73) & uVar136;
        uVar138 = -(uint)(fVar99 <= fVar133 - fVar74) & uVar138;
        auVar6._4_4_ = uVar131;
        auVar6._0_4_ = uVar129;
        auVar6._8_4_ = uVar136;
        auVar6._12_4_ = uVar138;
        iVar29 = movmskps(uVar87,auVar6);
        if (iVar29 != 0) {
          fVar86 = (float)(uVar126 ^
                          (uint)(fVar86 * fVar120 +
                                fVar104 * vVar61.field_0._0_4_ + fVar142 * fVar119));
          fVar88 = (float)(uVar127 ^
                          (uint)(fVar88 * fVar120 +
                                fVar106 * vVar61.field_0._0_4_ + fVar147 * fVar119));
          fVar89 = (float)(uVar128 ^
                          (uint)(fVar89 * fVar120 +
                                fVar116 * vVar61.field_0._0_4_ + fVar150 * fVar119));
          fVar98 = (float)(uVar130 ^
                          (uint)(fVar98 * fVar120 +
                                fVar103 * vVar61.field_0._0_4_ + fVar105 * fVar119));
          uVar129 = -(uint)(fVar86 <= *(float *)(ray + 0x80) * fVar121 &&
                           *(float *)(ray + 0x30) * fVar121 < fVar86) & uVar129;
          uVar131 = -(uint)(fVar88 <= *(float *)(ray + 0x84) * fVar125 &&
                           *(float *)(ray + 0x34) * fVar125 < fVar88) & uVar131;
          uVar136 = -(uint)(fVar89 <= *(float *)(ray + 0x88) * fVar132 &&
                           *(float *)(ray + 0x38) * fVar132 < fVar89) & uVar136;
          uVar138 = -(uint)(fVar98 <= *(float *)(ray + 0x8c) * fVar133 &&
                           *(float *)(ray + 0x3c) * fVar133 < fVar98) & uVar138;
          auVar8._4_4_ = uVar131;
          auVar8._0_4_ = uVar129;
          auVar8._8_4_ = uVar136;
          auVar8._12_4_ = uVar138;
          iVar29 = movmskps(iVar29,auVar8);
          if (iVar29 != 0) {
            auVar85._0_4_ = -(uint)(fVar76 != 0.0) & uVar129;
            auVar85._4_4_ = -(uint)(fVar80 != 0.0) & uVar131;
            auVar85._8_4_ = -(uint)(fVar81 != 0.0) & uVar136;
            auVar85._12_4_ = -(uint)(fVar75 != 0.0) & uVar138;
            iVar29 = movmskps(iVar29,auVar85);
            if (iVar29 != 0) {
              pGVar24 = (context->scene->geometries).items[(long)pGVar25].ptr;
              uVar87 = pGVar24->mask;
              auVar47._0_4_ = -(uint)((uVar87 & *(uint *)(ray + 0x90)) == 0);
              auVar47._4_4_ = -(uint)((uVar87 & *(uint *)(ray + 0x94)) == 0);
              auVar47._8_4_ = -(uint)((uVar87 & *(uint *)(ray + 0x98)) == 0);
              auVar47._12_4_ = -(uint)((uVar87 & *(uint *)(ray + 0x9c)) == 0);
              local_1a28 = ~auVar47 & auVar85;
              iVar29 = movmskps((int)ray,local_1a28);
              pGVar26 = pGVar25;
              if (iVar29 != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar5._4_4_ = fVar125;
                  auVar5._0_4_ = fVar121;
                  auVar5._8_4_ = fVar132;
                  auVar5._12_4_ = fVar133;
                  auVar77 = rcpps(local_1a28,auVar5);
                  fVar103 = auVar77._0_4_;
                  fVar105 = auVar77._4_4_;
                  fVar75 = auVar77._8_4_;
                  fVar76 = auVar77._12_4_;
                  fVar81 = (float)DAT_01f46a60;
                  fVar104 = DAT_01f46a60._4_4_;
                  fVar106 = DAT_01f46a60._12_4_;
                  fVar80 = DAT_01f46a60._8_4_;
                  fVar103 = (fVar81 - fVar121 * fVar103) * fVar103 + fVar103;
                  fVar105 = (fVar104 - fVar125 * fVar105) * fVar105 + fVar105;
                  fVar75 = (fVar80 - fVar132 * fVar75) * fVar75 + fVar75;
                  fVar76 = (fVar106 - fVar133 * fVar76) * fVar76 + fVar76;
                  local_18f8._0_4_ = fVar86 * fVar103;
                  local_18f8._4_4_ = fVar88 * fVar105;
                  fStack_18f0 = fVar89 * fVar75;
                  fStack_18ec = fVar98 * fVar76;
                  auVar79._0_4_ = fVar69 * fVar103;
                  auVar79._4_4_ = fVar70 * fVar105;
                  auVar79._8_4_ = fVar73 * fVar75;
                  auVar79._12_4_ = fVar74 * fVar76;
                  auVar146 = minps(auVar79,_DAT_01f46a60);
                  auVar72._0_4_ = fVar103 * fVar82;
                  auVar72._4_4_ = fVar105 * fVar83;
                  auVar72._8_4_ = fVar75 * fVar118;
                  auVar72._12_4_ = fVar76 * fVar99;
                  auVar77 = minps(auVar72,_DAT_01f46a60);
                  auVar93._0_4_ = fVar81 - auVar146._0_4_;
                  auVar93._4_4_ = fVar104 - auVar146._4_4_;
                  auVar93._8_4_ = fVar80 - auVar146._8_4_;
                  auVar93._12_4_ = fVar106 - auVar146._12_4_;
                  auVar101._0_4_ = fVar81 - auVar77._0_4_;
                  auVar101._4_4_ = fVar104 - auVar77._4_4_;
                  auVar101._8_4_ = fVar80 - auVar77._8_4_;
                  auVar101._12_4_ = fVar106 - auVar77._12_4_;
                  auVar13._8_8_ = uVar16;
                  auVar13._0_8_ = uVar15;
                  local_18d8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                               blendvps(auVar146,auVar93,auVar13);
                  local_18e8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                               blendvps(auVar77,auVar101,auVar13);
                  local_1928._0_8_ = CONCAT44(fVar120,fVar120);
                  local_1928._8_8_ = CONCAT44(fVar120,fVar120);
                  fStack_1904 = fVar119;
                  local_1928._32_4_ = fVar119;
                  fStack_1900 = fVar119;
                  fStack_18fc = fVar119;
                  args.valid = (int *)&Ng;
                  args.geometryUserPtr = &t;
                  args.context = (RTCRayQueryContext *)&v;
                  args.ray = (RTCRayN *)&u;
                  local_1928._16_16_ = (undefined1  [16])vVar61.field_0;
                  std::
                  _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                  ::
                  _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                            ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                              *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                       *)local_1928);
                  local_1928._0_8_ = Ng.field_0._0_8_;
                  local_1928._8_8_ = Ng.field_0._8_8_;
                  local_1928._16_16_ = (undefined1  [16])Ng.field_0.field_0.y.field_0;
                  stack0xffffffffffffe6f8 = (undefined1  [16])Ng.field_0.field_0.z.field_0;
                  local_18d8.i[1] = iVar27;
                  local_18d8.i[0] = iVar27;
                  local_18d8.i[2] = iVar27;
                  local_18d8.i[3] = iVar27;
                  local_18b8 = context->user->instID[0];
                  local_18a8 = context->user->instPrimID[0];
                  auVar77 = *(undefined1 (*) [16])(ray + 0x80);
                  auVar146 = blendvps(auVar77,(undefined1  [16])t.field_0,local_1a28);
                  *(undefined1 (*) [16])(ray + 0x80) = auVar146;
                  args.valid = (int *)local_19b8;
                  args.geometryUserPtr = pGVar24->userPtr;
                  args.context = context->user;
                  args.hit = (RTCHitN *)local_1928;
                  args.N = 4;
                  pGVar25 = (Geometry *)ray;
                  args.ray = (RTCRayN *)ray;
                  local_19b8 = local_1a28;
                  local_18c8 = uVar117;
                  uStack_18c4 = uVar117;
                  uStack_18c0 = uVar117;
                  uStack_18bc = uVar117;
                  uStack_18b4 = local_18b8;
                  uStack_18b0 = local_18b8;
                  uStack_18ac = local_18b8;
                  uStack_18a4 = local_18a8;
                  uStack_18a0 = local_18a8;
                  uStack_189c = local_18a8;
                  if (pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar24->occlusionFilterN)(&args);
                  }
                  if (local_19b8 == (undefined1  [16])0x0) {
                    auVar63._8_4_ = 0xffffffff;
                    auVar63._0_8_ = 0xffffffffffffffff;
                    auVar63._12_4_ = 0xffffffff;
                    auVar63 = auVar63 ^ _DAT_01f46b70;
                  }
                  else {
                    pGVar26 = (Geometry *)context->args;
                    pGVar25 = pGVar26;
                    if ((pGVar26->device != (Device *)0x0) &&
                       ((((ulong)(pGVar26->super_RefCount)._vptr_RefCount & 2) != 0 ||
                        (pGVar25 = pGVar24, ((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                      (*(code *)pGVar26->device)(&args);
                    }
                    local_1a28._0_4_ = local_19b8._0_4_;
                    local_1a28._4_4_ = local_19b8._4_4_;
                    local_1a28._8_4_ = local_19b8._8_4_;
                    local_1a28._12_4_ = local_19b8._12_4_;
                    auVar49._0_4_ = -(uint)(local_1a28._0_4_ == 0);
                    auVar49._4_4_ = -(uint)(local_1a28._4_4_ == 0);
                    auVar49._8_4_ = -(uint)(local_1a28._8_4_ == 0);
                    auVar49._12_4_ = -(uint)(local_1a28._12_4_ == 0);
                    auVar63 = auVar49 ^ _DAT_01f46b70;
                    auVar146 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),
                                        auVar49);
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar146;
                  }
                  auVar65._0_4_ = auVar63._0_4_ << 0x1f;
                  auVar65._4_4_ = auVar63._4_4_ << 0x1f;
                  auVar65._8_4_ = auVar63._8_4_ << 0x1f;
                  auVar65._12_4_ = auVar63._12_4_ << 0x1f;
                  local_1a28._4_4_ = auVar65._4_4_ >> 0x1f;
                  local_1a28._0_4_ = auVar65._0_4_ >> 0x1f;
                  local_1a28._8_4_ = auVar65._8_4_ >> 0x1f;
                  local_1a28._12_4_ = auVar65._12_4_ >> 0x1f;
                  auVar77 = blendvps(auVar77,*(undefined1 (*) [16])(ray + 0x80),auVar65);
                  *(undefined1 (*) [16])(ray + 0x80) = auVar77;
                  pGVar24 = (Geometry *)ray;
                }
                iVar29 = (int)pGVar24;
                uVar20 = ~local_1a28._0_4_ & uVar20;
                uVar95 = ~local_1a28._4_4_ & uVar95;
                uVar96 = ~local_1a28._8_4_ & uVar96;
                uVar97 = ~local_1a28._12_4_ & uVar97;
                pGVar26 = pGVar25;
              }
            }
          }
        }
      }
      auVar10._4_4_ = uVar95;
      auVar10._0_4_ = uVar20;
      auVar10._8_4_ = uVar96;
      auVar10._12_4_ = uVar97;
      iVar27 = movmskps(iVar29,auVar10);
      if (iVar27 == 0) {
        fVar98 = INFINITY;
        fVar103 = INFINITY;
        fVar105 = INFINITY;
        fVar107 = INFINITY;
        uVar21 = 0;
        goto LAB_006ca122;
      }
      fVar118 = fVar56 - fVar53;
      fVar119 = fVar56 - fVar53;
      fVar120 = fVar56 - fVar53;
      fVar53 = fVar56 - fVar53;
      fVar137 = fVar67 - fVar55;
      fVar143 = fVar67 - fVar55;
      fVar148 = fVar67 - fVar55;
      fVar55 = fVar67 - fVar55;
      fVar104 = fVar68 - fVar54;
      fVar106 = fVar68 - fVar54;
      fVar116 = fVar68 - fVar54;
      fVar54 = fVar68 - fVar54;
      fVar144 = fVar107 - fVar56;
      fVar149 = fVar107 - fVar56;
      fVar152 = fVar107 - fVar56;
      fVar107 = fVar107 - fVar56;
      fVar155 = fVar108 - fVar67;
      fVar157 = fVar108 - fVar67;
      fVar159 = fVar108 - fVar67;
      fVar108 = fVar108 - fVar67;
      fVar139 = fVar39 - fVar68;
      fVar140 = fVar39 - fVar68;
      fVar141 = fVar39 - fVar68;
      fVar39 = fVar39 - fVar68;
      fVar89 = fVar155 * fVar104 - fVar139 * fVar137;
      fVar99 = fVar157 * fVar106 - fVar140 * fVar143;
      auVar62._0_8_ = CONCAT44(fVar99,fVar89);
      auVar62._8_4_ = fVar159 * fVar116 - fVar141 * fVar148;
      auVar62._12_4_ = fVar108 * fVar54 - fVar39 * fVar55;
      vVar71.field_0._0_4_ = fVar139 * fVar118 - fVar144 * fVar104;
      vVar71.field_0._4_4_ = fVar140 * fVar119 - fVar149 * fVar106;
      vVar71.field_0._8_4_ = fVar141 * fVar120 - fVar152 * fVar116;
      vVar71.field_0._12_4_ = fVar39 * fVar53 - fVar107 * fVar54;
      vVar78.field_0._0_4_ = fVar144 * fVar137 - fVar155 * fVar118;
      vVar78.field_0._4_4_ = fVar149 * fVar143 - fVar157 * fVar119;
      vVar78.field_0._8_4_ = fVar152 * fVar148 - fVar159 * fVar120;
      vVar78.field_0._12_4_ = fVar107 * fVar55 - fVar108 * fVar53;
      fVar83 = fVar56 - *(float *)ray;
      fVar86 = fVar56 - *(float *)(ray + 4);
      fVar88 = fVar56 - *(float *)(ray + 8);
      fVar56 = fVar56 - *(float *)(ray + 0xc);
      fVar121 = fVar67 - *(float *)(ray + 0x10);
      fVar125 = fVar67 - *(float *)(ray + 0x14);
      fVar132 = fVar67 - *(float *)(ray + 0x18);
      fVar67 = fVar67 - *(float *)(ray + 0x1c);
      fVar133 = fVar68 - *(float *)(ray + 0x20);
      fVar134 = fVar68 - *(float *)(ray + 0x24);
      fVar135 = fVar68 - *(float *)(ray + 0x28);
      fVar68 = fVar68 - *(float *)(ray + 0x2c);
      fVar98 = *(float *)(ray + 0x40);
      fVar103 = *(float *)(ray + 0x44);
      fVar105 = *(float *)(ray + 0x48);
      fVar69 = *(float *)(ray + 0x4c);
      fVar70 = *(float *)(ray + 0x50);
      fVar73 = *(float *)(ray + 0x54);
      fVar74 = *(float *)(ray + 0x58);
      fVar75 = *(float *)(ray + 0x5c);
      fVar76 = *(float *)(ray + 0x60);
      fVar80 = *(float *)(ray + 100);
      fVar81 = *(float *)(ray + 0x68);
      fVar82 = *(float *)(ray + 0x6c);
      fVar142 = fVar121 * fVar76 - fVar133 * fVar70;
      fVar147 = fVar125 * fVar80 - fVar134 * fVar73;
      fVar150 = fVar132 * fVar81 - fVar135 * fVar74;
      fVar151 = fVar67 * fVar82 - fVar68 * fVar75;
      fVar153 = fVar133 * fVar98 - fVar83 * fVar76;
      fVar154 = fVar134 * fVar103 - fVar86 * fVar80;
      fVar156 = fVar135 * fVar105 - fVar88 * fVar81;
      fVar158 = fVar68 * fVar69 - fVar56 * fVar82;
      fVar160 = fVar83 * fVar70 - fVar121 * fVar98;
      fVar122 = fVar86 * fVar73 - fVar125 * fVar103;
      fVar123 = fVar88 * fVar74 - fVar132 * fVar105;
      fVar124 = fVar56 * fVar75 - fVar67 * fVar69;
      fVar98 = fVar98 * fVar89 + fVar70 * vVar71.field_0._0_4_ + fVar76 * vVar78.field_0._0_4_;
      fVar103 = fVar103 * fVar99 + fVar73 * vVar71.field_0._4_4_ + fVar80 * vVar78.field_0._4_4_;
      fVar105 = fVar105 * auVar62._8_4_ +
                fVar74 * vVar71.field_0._8_4_ + fVar81 * vVar78.field_0._8_4_;
      fVar69 = fVar69 * auVar62._12_4_ +
               fVar75 * vVar71.field_0._12_4_ + fVar82 * vVar78.field_0._12_4_;
      uVar117 = (uint)fVar98 & 0x80000000;
      uVar87 = (uint)fVar103 & 0x80000000;
      uVar126 = (uint)fVar105 & 0x80000000;
      uVar127 = (uint)fVar69 & 0x80000000;
      fVar70 = (float)((uint)(fVar144 * fVar142 + fVar155 * fVar153 + fVar139 * fVar160) ^ uVar117);
      fVar73 = (float)((uint)(fVar149 * fVar147 + fVar157 * fVar154 + fVar140 * fVar122) ^ uVar87);
      fVar74 = (float)((uint)(fVar152 * fVar150 + fVar159 * fVar156 + fVar141 * fVar123) ^ uVar126);
      fVar107 = (float)((uint)(fVar107 * fVar151 + fVar108 * fVar158 + fVar39 * fVar124) ^ uVar127);
      uVar128 = -(uint)(0.0 <= fVar70) & uVar20;
      uVar130 = -(uint)(0.0 <= fVar73) & uVar95;
      uVar129 = -(uint)(0.0 <= fVar74) & uVar96;
      uVar131 = -(uint)(0.0 <= fVar107) & uVar97;
      auVar7._4_4_ = uVar130;
      auVar7._0_4_ = uVar128;
      auVar7._8_4_ = uVar129;
      auVar7._12_4_ = uVar131;
      iVar27 = movmskps(iVar27,auVar7);
      if (iVar27 != 0) {
        fVar108 = (float)((uint)(fVar118 * fVar142 + fVar137 * fVar153 + fVar104 * fVar160) ^
                         uVar117);
        fVar39 = (float)((uint)(fVar119 * fVar147 + fVar143 * fVar154 + fVar106 * fVar122) ^ uVar87)
        ;
        fVar75 = (float)((uint)(fVar120 * fVar150 + fVar148 * fVar156 + fVar116 * fVar123) ^ uVar126
                        );
        fVar53 = (float)((uint)(fVar53 * fVar151 + fVar55 * fVar158 + fVar54 * fVar124) ^ uVar127);
        uVar128 = -(uint)(0.0 <= fVar108) & uVar128;
        uVar130 = -(uint)(0.0 <= fVar39) & uVar130;
        uVar129 = -(uint)(0.0 <= fVar75) & uVar129;
        uVar131 = -(uint)(0.0 <= fVar53) & uVar131;
        auVar3._4_4_ = uVar130;
        auVar3._0_4_ = uVar128;
        auVar3._8_4_ = uVar129;
        auVar3._12_4_ = uVar131;
        iVar27 = movmskps(iVar27,auVar3);
        if (iVar27 != 0) {
          fVar55 = ABS(fVar98);
          fVar54 = ABS(fVar103);
          auVar100._0_8_ = CONCAT44(fVar103,fVar98) & 0x7fffffff7fffffff;
          auVar100._8_4_ = ABS(fVar105);
          auVar100._12_4_ = ABS(fVar69);
          auVar112._0_4_ = -(uint)(fVar108 <= fVar55 - fVar70) & uVar128;
          auVar112._4_4_ = -(uint)(fVar39 <= fVar54 - fVar73) & uVar130;
          auVar112._8_4_ = -(uint)(fVar75 <= auVar100._8_4_ - fVar74) & uVar129;
          auVar112._12_4_ = -(uint)(fVar53 <= auVar100._12_4_ - fVar107) & uVar131;
          iVar27 = movmskps(iVar27,auVar112);
          if (iVar27 != 0) {
            fVar76 = (float)(uVar117 ^
                            (uint)(fVar83 * fVar89 +
                                  fVar121 * vVar71.field_0._0_4_ + fVar133 * vVar78.field_0._0_4_));
            fVar80 = (float)(uVar87 ^ (uint)(fVar86 * fVar99 +
                                            fVar125 * vVar71.field_0._4_4_ +
                                            fVar134 * vVar78.field_0._4_4_));
            fVar81 = (float)(uVar126 ^
                            (uint)(fVar88 * auVar62._8_4_ +
                                  fVar132 * vVar71.field_0._8_4_ + fVar135 * vVar78.field_0._8_4_));
            fVar56 = (float)(uVar127 ^
                            (uint)(fVar56 * auVar62._12_4_ +
                                  fVar67 * vVar71.field_0._12_4_ + fVar68 * vVar78.field_0._12_4_));
            uVar117 = -(uint)(fVar76 <= *(float *)(ray + 0x80) * fVar55 &&
                             *(float *)(ray + 0x30) * fVar55 < fVar76) & auVar112._0_4_;
            uVar87 = -(uint)(fVar80 <= *(float *)(ray + 0x84) * fVar54 &&
                            *(float *)(ray + 0x34) * fVar54 < fVar80) & auVar112._4_4_;
            uVar126 = -(uint)(fVar81 <= *(float *)(ray + 0x88) * auVar100._8_4_ &&
                             *(float *)(ray + 0x38) * auVar100._8_4_ < fVar81) & auVar112._8_4_;
            uVar127 = -(uint)(fVar56 <= *(float *)(ray + 0x8c) * auVar100._12_4_ &&
                             *(float *)(ray + 0x3c) * auVar100._12_4_ < fVar56) & auVar112._12_4_;
            auVar4._4_4_ = uVar87;
            auVar4._0_4_ = uVar117;
            auVar4._8_4_ = uVar126;
            auVar4._12_4_ = uVar127;
            iVar27 = movmskps(iVar27,auVar4);
            if (iVar27 != 0) {
              auVar92._0_4_ = -(uint)(fVar98 != 0.0) & uVar117;
              auVar92._4_4_ = -(uint)(fVar103 != 0.0) & uVar87;
              auVar92._8_4_ = -(uint)(fVar105 != 0.0) & uVar126;
              auVar92._12_4_ = -(uint)(fVar69 != 0.0) & uVar127;
              iVar27 = movmskps(iVar27,auVar92);
              if (iVar27 != 0) {
                uVar117 = *(uint *)(lVar32 + lVar37);
                pGVar25 = (context->scene->geometries).items[uVar117].ptr;
                uVar87 = pGVar25->mask;
                auVar48._0_4_ = -(uint)((uVar87 & *(uint *)(ray + 0x90)) == 0);
                auVar48._4_4_ = -(uint)((uVar87 & *(uint *)(ray + 0x94)) == 0);
                auVar48._8_4_ = -(uint)((uVar87 & *(uint *)(ray + 0x98)) == 0);
                auVar48._12_4_ = -(uint)((uVar87 & *(uint *)(ray + 0x9c)) == 0);
                _local_1a78 = ~auVar48 & auVar92;
                iVar27 = movmskps((int)ray,_local_1a78);
                if (iVar27 != 0) {
                  uVar21 = *(undefined4 *)(lVar32 + 0x10 + lVar37);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar77 = rcpps(auVar92,auVar100);
                    fVar98 = auVar77._0_4_;
                    fVar103 = auVar77._4_4_;
                    fVar105 = auVar77._8_4_;
                    fVar67 = auVar77._12_4_;
                    fVar69 = (float)DAT_01f46a60;
                    fVar82 = DAT_01f46a60._4_4_;
                    fVar83 = DAT_01f46a60._12_4_;
                    fVar68 = DAT_01f46a60._8_4_;
                    fVar98 = (fVar69 - fVar55 * fVar98) * fVar98 + fVar98;
                    fVar103 = (fVar82 - fVar54 * fVar103) * fVar103 + fVar103;
                    fVar105 = (fVar68 - auVar100._8_4_ * fVar105) * fVar105 + fVar105;
                    fVar67 = (fVar83 - auVar100._12_4_ * fVar67) * fVar67 + fVar67;
                    auVar145._0_4_ = fVar70 * fVar98;
                    auVar145._4_4_ = fVar73 * fVar103;
                    auVar145._8_4_ = fVar74 * fVar105;
                    auVar145._12_4_ = fVar107 * fVar67;
                    auVar146 = minps(auVar145,_DAT_01f46a60);
                    auVar113._0_4_ = fVar98 * fVar108;
                    auVar113._4_4_ = fVar103 * fVar39;
                    auVar113._8_4_ = fVar105 * fVar75;
                    auVar113._12_4_ = fVar67 * fVar53;
                    auVar77 = minps(auVar113,_DAT_01f46a60);
                    auVar94._0_4_ = fVar69 - auVar146._0_4_;
                    auVar94._4_4_ = fVar82 - auVar146._4_4_;
                    auVar94._8_4_ = fVar68 - auVar146._8_4_;
                    auVar94._12_4_ = fVar83 - auVar146._12_4_;
                    auVar102._0_4_ = fVar69 - auVar77._0_4_;
                    auVar102._4_4_ = fVar82 - auVar77._4_4_;
                    auVar102._8_4_ = fVar68 - auVar77._8_4_;
                    auVar102._12_4_ = fVar83 - auVar77._12_4_;
                    auVar12._8_8_ = uVar18;
                    auVar12._0_8_ = uVar17;
                    local_18d8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 blendvps(auVar146,auVar94,auVar12);
                    local_18e8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 blendvps(auVar77,auVar102,auVar12);
                    uStack_1940 = auVar62._8_8_;
                    local_1928._8_8_ = uStack_1940;
                    local_18f8._4_4_ = fVar80 * fVar103;
                    local_18f8._0_4_ = fVar76 * fVar98;
                    fStack_18f0 = fVar81 * fVar105;
                    fStack_18ec = fVar56 * fVar67;
                    args.valid = (int *)&Ng;
                    args.geometryUserPtr = &t;
                    args.context = (RTCRayQueryContext *)&v;
                    args.ray = (RTCRayN *)&u;
                    local_1928._0_8_ = auVar62._0_8_;
                    local_1928._16_16_ = (undefined1  [16])vVar71.field_0;
                    unique0x10002398 = (undefined1  [16])vVar78.field_0;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                         *)local_1928);
                    local_1928._0_8_ = Ng.field_0._0_8_;
                    local_1928._8_8_ = Ng.field_0._8_8_;
                    local_1928._16_16_ = (undefined1  [16])Ng.field_0.field_0.y.field_0;
                    stack0xffffffffffffe6f8 = (undefined1  [16])Ng.field_0.field_0.z.field_0;
                    local_18d8.i[1] = uVar21;
                    local_18d8.i[0] = uVar21;
                    local_18d8.i[2] = uVar21;
                    local_18d8.i[3] = uVar21;
                    local_18b8 = context->user->instID[0];
                    local_18a8 = context->user->instPrimID[0];
                    auVar77 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar146 = blendvps(auVar77,(undefined1  [16])t.field_0,_local_1a78);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar146;
                    args.valid = (int *)local_19b8;
                    args.geometryUserPtr = pGVar25->userPtr;
                    args.context = context->user;
                    args.hit = (RTCHitN *)local_1928;
                    args.N = 4;
                    pGVar26 = (Geometry *)ray;
                    args.ray = (RTCRayN *)ray;
                    local_19b8 = _local_1a78;
                    local_18c8 = uVar117;
                    uStack_18c4 = uVar117;
                    uStack_18c0 = uVar117;
                    uStack_18bc = uVar117;
                    uStack_18b4 = local_18b8;
                    uStack_18b0 = local_18b8;
                    uStack_18ac = local_18b8;
                    uStack_18a4 = local_18a8;
                    uStack_18a0 = local_18a8;
                    uStack_189c = local_18a8;
                    if (pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar25->occlusionFilterN)(&args);
                    }
                    if (local_19b8 == (undefined1  [16])0x0) {
                      auVar64._8_4_ = 0xffffffff;
                      auVar64._0_8_ = 0xffffffffffffffff;
                      auVar64._12_4_ = 0xffffffff;
                      auVar64 = auVar64 ^ _DAT_01f46b70;
                    }
                    else {
                      pGVar24 = (Geometry *)context->args;
                      pGVar26 = pGVar24;
                      if ((pGVar24->device != (Device *)0x0) &&
                         ((((ulong)(pGVar24->super_RefCount)._vptr_RefCount & 2) != 0 ||
                          (pGVar26 = pGVar25, ((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
                        (*(code *)pGVar24->device)(&args);
                      }
                      local_1a78._0_4_ = local_19b8._0_4_;
                      local_1a78._4_4_ = local_19b8._4_4_;
                      fStack_1a70 = local_19b8._8_4_;
                      fStack_1a6c = local_19b8._12_4_;
                      auVar50._0_4_ = -(uint)(local_1a78._0_4_ == 0);
                      auVar50._4_4_ = -(uint)(local_1a78._4_4_ == 0);
                      auVar50._8_4_ = -(uint)(fStack_1a70 == 0.0);
                      auVar50._12_4_ = -(uint)(fStack_1a6c == 0.0);
                      auVar64 = auVar50 ^ _DAT_01f46b70;
                      auVar146 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),
                                          auVar50);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar146;
                    }
                    auVar66._0_4_ = auVar64._0_4_ << 0x1f;
                    auVar66._4_4_ = auVar64._4_4_ << 0x1f;
                    auVar66._8_4_ = auVar64._8_4_ << 0x1f;
                    auVar66._12_4_ = auVar64._12_4_ << 0x1f;
                    local_1a78._4_4_ = auVar66._4_4_ >> 0x1f;
                    local_1a78._0_4_ = auVar66._0_4_ >> 0x1f;
                    fStack_1a70 = (float)(auVar66._8_4_ >> 0x1f);
                    fStack_1a6c = (float)(auVar66._12_4_ >> 0x1f);
                    auVar77 = blendvps(auVar77,*(undefined1 (*) [16])(ray + 0x80),auVar66);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar77;
                    pGVar25 = (Geometry *)ray;
                  }
                  iVar27 = (int)pGVar25;
                  uVar20 = ~local_1a78._0_4_ & uVar20;
                  uVar95 = ~local_1a78._4_4_ & uVar95;
                  uVar96 = ~(uint)fStack_1a70 & uVar96;
                  uVar97 = ~(uint)fStack_1a6c & uVar97;
                }
              }
            }
          }
        }
      }
      fVar107 = INFINITY;
      fVar105 = INFINITY;
      fVar103 = INFINITY;
      fVar98 = INFINITY;
      auVar11._4_4_ = uVar95;
      auVar11._0_4_ = uVar20;
      auVar11._8_4_ = uVar96;
      auVar11._12_4_ = uVar97;
      uVar117 = movmskps(iVar27,auVar11);
      pSVar22 = (Scene *)(ulong)uVar117;
      lVar37 = lVar37 + 4;
    } while (uVar117 != 0);
    uVar21 = 0;
LAB_006ca122:
    auVar45._0_4_ = auVar45._0_4_ & uVar20;
    auVar45._4_4_ = uVar109 & uVar95;
    auVar45._8_4_ = uVar114 & uVar96;
    auVar45._12_4_ = uVar115 & uVar97;
    uVar20 = movmskps(uVar21,auVar45);
    pIVar33 = (Intersectors *)((long)&pIVar33->ptr + 1);
    lVar32 = lVar32 + 0x60;
  } while (uVar20 != 0);
  auVar51._0_8_ = auVar45._0_8_ ^ 0xffffffffffffffff;
  auVar51._8_4_ = auVar45._8_4_ ^ 0xffffffff;
  auVar51._12_4_ = auVar45._12_4_ ^ 0xffffffff;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       (auVar51 | (undefined1  [16])terminated.field_0);
  uVar20 = movmskps(uVar20,(undefined1  [16])terminated.field_0);
  if (uVar20 == 0xf) goto LAB_006ca23e;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                (undefined1  [16])terminated.field_0);
  goto LAB_006c908a;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }